

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::E_formatter<spdlog::details::null_scoped_padder>::format
          (E_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  memory_buf_t *in_RDX;
  long in_RSI;
  long in_RDI;
  rep seconds;
  duration duration;
  null_scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffb8;
  null_scoped_padder local_29;
  undefined8 local_28;
  
  local_28 = 10;
  null_scoped_padder::null_scoped_padder(&local_29,10,(padding_info *)(in_RDI + 8),in_RCX);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)(in_RSI + 0x18));
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffb8.__r);
  std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
            ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffb8);
  fmt_helper::append_int<long>(in_RSI,in_RDX);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }